

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.cpp
# Opt level: O2

void RemoveUnnecessaryTransactions(PartiallySignedTransaction *psbtx,int *sighash_type)

{
  pointer puVar1;
  bool bVar2;
  reference pvVar3;
  pointer puVar4;
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> wit_prog;
  int wit_ver;
  vector<unsigned_int,_std::allocator<unsigned_int>_> to_drop;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  int local_60;
  uint local_5c;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*sighash_type & 0x80) == 0) {
    local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_58._M_impl.super__Vector_impl_data._M_start = (uint *)0x0;
    local_58._M_impl.super__Vector_impl_data._M_finish = (uint *)0x0;
    local_5c = 0;
    while( true ) {
      if ((ulong)(((long)(psbtx->inputs).super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                  (long)(psbtx->inputs).super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>.
                        _M_impl.super__Vector_impl_data._M_start) / 800) <= (ulong)local_5c) break;
      pvVar3 = std::vector<PSBTInput,_std::allocator<PSBTInput>_>::at
                         (&psbtx->inputs,(ulong)local_5c);
      local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      if ((pvVar3->witness_utxo).nValue == -1) {
LAB_002e6648:
        if (local_58._M_impl.super__Vector_impl_data._M_finish !=
            local_58._M_impl.super__Vector_impl_data._M_start) {
          local_58._M_impl.super__Vector_impl_data._M_finish =
               local_58._M_impl.super__Vector_impl_data._M_start;
        }
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_78);
        break;
      }
      bVar2 = CScript::IsWitnessProgram
                        (&(pvVar3->witness_utxo).scriptPubKey,&local_60,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_78);
      if ((!bVar2) || (local_60 == 0)) goto LAB_002e6648;
      if ((pvVar3->non_witness_utxo).
          super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_58,&local_5c);
      }
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_78);
      local_5c = local_5c + 1;
    }
    puVar1 = local_58._M_impl.super__Vector_impl_data._M_finish;
    for (puVar4 = local_58._M_impl.super__Vector_impl_data._M_start; puVar4 != puVar1;
        puVar4 = puVar4 + 1) {
      local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      pvVar3 = std::vector<PSBTInput,_std::allocator<PSBTInput>_>::at(&psbtx->inputs,(ulong)*puVar4)
      ;
      std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)pvVar3,
                 (__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)&local_78);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &local_78._M_impl.super__Vector_impl_data._M_finish);
    }
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void RemoveUnnecessaryTransactions(PartiallySignedTransaction& psbtx, const int& sighash_type)
{
    // Only drop non_witness_utxos if sighash_type != SIGHASH_ANYONECANPAY
    if ((sighash_type & 0x80) != SIGHASH_ANYONECANPAY) {
        // Figure out if any non_witness_utxos should be dropped
        std::vector<unsigned int> to_drop;
        for (unsigned int i = 0; i < psbtx.inputs.size(); ++i) {
            const auto& input = psbtx.inputs.at(i);
            int wit_ver;
            std::vector<unsigned char> wit_prog;
            if (input.witness_utxo.IsNull() || !input.witness_utxo.scriptPubKey.IsWitnessProgram(wit_ver, wit_prog)) {
                // There's a non-segwit input or Segwit v0, so we cannot drop any witness_utxos
                to_drop.clear();
                break;
            }
            if (wit_ver == 0) {
                // Segwit v0, so we cannot drop any non_witness_utxos
                to_drop.clear();
                break;
            }
            if (input.non_witness_utxo) {
                to_drop.push_back(i);
            }
        }

        // Drop the non_witness_utxos that we can drop
        for (unsigned int i : to_drop) {
            psbtx.inputs.at(i).non_witness_utxo = nullptr;
        }
    }
}